

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O2

SQObject __thiscall
SQCompilation::CodegenVisitor::selectLiteral(CodegenVisitor *this,LiteralExpr *lit)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong in_RDX;
  SQObject SVar3;
  SQObject SVar4;
  
  switch(lit->_kind) {
  case LK_STRING:
    SVar3 = SQFuncState::CreateString(this->_fs,(lit->_v).s,-1);
    uVar2 = SVar3._0_8_ & 0xffffffff00000000;
    goto LAB_0015a3fa;
  case LK_INT:
    in_RDX = (lit->_v).raw;
    uVar2 = in_RDX & 0xffffffff00000000;
    uVar1 = 0x5000002;
    break;
  case LK_FLOAT:
    in_RDX = (ulong)(uint)(lit->_v).f;
    uVar1 = 0x5000004;
    goto LAB_0015a3d3;
  case LK_BOOL:
    in_RDX = (ulong)(lit->_v).b;
    uVar1 = 0x1000008;
LAB_0015a3d3:
    uVar2 = 0;
    break;
  case LK_NULL:
    uVar1 = 0x1000001;
    uVar2 = 0;
    in_RDX = 0;
    break;
  default:
    uVar2 = 0;
    uVar1 = 0;
  }
  SVar3._unVal.nInteger = in_RDX & 0xffffffff | uVar2;
  SVar3._type = (int)uVar1;
  SVar3._flags = (char)((ulong)uVar1 >> 0x20);
  SVar3._5_3_ = (int3)((ulong)uVar1 >> 0x28);
  uVar2 = 0;
LAB_0015a3fa:
  SVar4._unVal = SVar3._unVal;
  SVar4._0_8_ = SVar3._type | uVar2;
  return SVar4;
}

Assistant:

enum LiteralKind kind() const { return _kind;  }